

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  ParamDictPrivate *pPVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  undefined1 *puVar4;
  long lVar5;
  
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&this->d->params[0].type + lVar5) = 0;
    pPVar1 = this->d;
    piVar2 = *(int **)((long)&pPVar1->params[0].v.refcount + lVar5);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = *(void **)((long)&pPVar1->params[0].v.data + lVar5);
        plVar3 = *(long **)((long)&pPVar1->params[0].v.allocator + lVar5);
        if (plVar3 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pPVar1->params[0].v.cstep + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.refcount + lVar5 + 4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.elemsize + lVar5 + 4) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.data + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.refcount + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.w + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.d + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.allocator + lVar5) = 0;
    *(undefined8 *)((long)&pPVar1->params[0].v.dims + lVar5) = 0;
    puVar4 = *(undefined1 **)((long)&this->d->params[0].s._M_dataplus._M_p + lVar5);
    *(undefined8 *)((long)&this->d->params[0].s._M_string_length + lVar5) = 0;
    *puVar4 = 0;
    lVar5 = lVar5 + 0x70;
  } while (lVar5 != 0xe00);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].i = 0;
        d->params[i].v = Mat();
        d->params[i].s.clear();
    }
}